

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Encoding.hpp
# Opt level: O0

detected_language *
csv::icu::encoding::TextEncodingForFile(detected_language *__return_storage_ptr__,char *file)

{
  UBool UVar1;
  size_t length;
  size_t read;
  char buf [4096];
  FILE *fp;
  char *pcStack_18;
  UErrorCode u_glob_status;
  char *file_local;
  
  fp._4_4_ = U_ZERO_ERROR;
  buf[0xff8] = '\0';
  buf[0xff9] = '\0';
  buf[0xffa] = '\0';
  buf[0xffb] = '\0';
  buf[0xffc] = '\0';
  buf[0xffd] = '\0';
  buf[0xffe] = '\0';
  buf[0xfff] = '\0';
  pcStack_18 = file;
  file_local = (char *)__return_storage_ptr__;
  u_init_70((long)&fp + 4);
  UVar1 = U_SUCCESS(fp._4_4_);
  if ((UVar1 != '\0') &&
     (buf._4088_8_ = fopen(pcStack_18,"rb"), (FILE *)buf._4088_8_ != (FILE *)0x0)) {
    length = fread(&read,1,0x1000,(FILE *)buf._4088_8_);
    fclose((FILE *)buf._4088_8_);
    TextEncodingForData(__return_storage_ptr__,(char *)&read,length);
    return __return_storage_ptr__;
  }
  memset(__return_storage_ptr__,0,0x48);
  detected_language::detected_language(__return_storage_ptr__);
  return __return_storage_ptr__;
}

Assistant:

detected_language TextEncodingForFile(const char* file) {
		UErrorCode u_glob_status = U_ZERO_ERROR;
		FILE* fp(0);

		u_init(&u_glob_status);
		if (U_SUCCESS(u_glob_status) &&
			(fp = fopen(file, "rb")) != NULL) {
			// Read (up to) the first 4k.  It should give us enough to detect the file
			char buf[4096];
			size_t read = fread(buf, 1, 4096, fp);

			fclose(fp);
			return TextEncodingForData(buf, read);
		}
		return detected_language();
	}